

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

void __thiscall cinatra::context::context(context *this,uri_t *u,http_method mthd)

{
  undefined4 in_EDX;
  uri_t *in_RDI;
  uri_t *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  uri_t *this_01;
  
  this_01 = in_RDI;
  uri_t::get_host_abi_cxx11_((uri_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->host;
  uri_t::get_port_abi_cxx11_(in_stack_00000058);
  uri_t::get_path_abi_cxx11_(this_01);
  uri_t::get_query_abi_cxx11_((uri_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::__cxx11::string::string(this_00);
  *(undefined4 *)&in_RDI[1].host._M_str = in_EDX;
  return;
}

Assistant:

context(const uri_t &u, http_method mthd)
      : host(u.get_host()),
        port(u.get_port()),
        path(u.get_path()),
        query(u.get_query()),
        method(mthd) {}